

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

_Bool sysbvm_identitySet_find
                (sysbvm_tuple_t set,sysbvm_tuple_t element,sysbvm_tuple_t *outFoundElement)

{
  _Bool _Var1;
  intptr_t iVar2;
  sysbvm_array_t *storage;
  sysbvm_identitySet_t *setObject;
  intptr_t elementIndex;
  sysbvm_tuple_t *outFoundElement_local;
  sysbvm_tuple_t element_local;
  sysbvm_tuple_t set_local;
  
  *outFoundElement = 0;
  _Var1 = sysbvm_tuple_isNonNullPointer(set);
  if (_Var1) {
    iVar2 = sysbvm_identitySet_scanFor(set,element);
    if (iVar2 < 0) {
      set_local._7_1_ = false;
    }
    else if (*(long *)(*(long *)(set + 0x18) + 0x10 + iVar2 * 8) == 0x3f) {
      set_local._7_1_ = false;
    }
    else {
      *outFoundElement = *(sysbvm_tuple_t *)(*(long *)(set + 0x18) + 0x10 + iVar2 * 8);
      set_local._7_1_ = true;
    }
  }
  else {
    set_local._7_1_ = false;
  }
  return set_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_identitySet_find(sysbvm_tuple_t set, sysbvm_tuple_t element, sysbvm_tuple_t *outFoundElement)
{
    *outFoundElement = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(set))
        return false;

    intptr_t elementIndex = sysbvm_identitySet_scanFor(set, element);
    if(elementIndex < 0)
        return false;

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    if(storage->elements[elementIndex] == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
        return false;

    *outFoundElement = storage->elements[elementIndex];
    return true;
}